

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdSkel.cc
# Opt level: O0

bool __thiscall
tinyusdz::BlendShape::add_inbetweenBlendShape(BlendShape *this,double weight,Attribute *attr)

{
  bool bVar1;
  ulong uVar2;
  string *args;
  AttrMeta *pAVar3;
  mapped_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  Property local_660;
  optional<double> local_80;
  allocator local_69;
  string local_68 [32];
  undefined1 local_48 [8];
  string attr_name;
  Attribute *attr_local;
  double weight_local;
  BlendShape *this_local;
  
  attr_name.field_2._8_8_ = attr;
  attr_local = (Attribute *)weight;
  weight_local = (double)this;
  Attribute::name_abi_cxx11_(attr);
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    bVar1 = Attribute::is_uniform((Attribute *)attr_name.field_2._8_8_);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    else {
      bVar1 = Attribute::is_value((Attribute *)attr_name.field_2._8_8_);
      if (bVar1) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_68,"{}:{}",&local_69);
        args = Attribute::name_abi_cxx11_((Attribute *)attr_name.field_2._8_8_);
        fmt::format<char_const*,std::__cxx11::string>
                  ((string *)local_48,(fmt *)local_68,(string *)&kInbetweensNamespace,(char **)args,
                   in_R8);
        ::std::__cxx11::string::~string(local_68);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_69);
        Attribute::set_name((Attribute *)attr_name.field_2._8_8_,(string *)local_48);
        nonstd::optional_lite::optional<double>::optional<const_double_&,_0>
                  (&local_80,(double *)&attr_local);
        pAVar3 = Attribute::metas((Attribute *)attr_name.field_2._8_8_);
        nonstd::optional_lite::optional<double>::operator=(&pAVar3->weight,&local_80);
        nonstd::optional_lite::optional<double>::~optional(&local_80);
        Property::Property(&local_660,(Attribute *)attr_name.field_2._8_8_,false);
        this_00 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                  ::operator[](&this->props,(key_type *)local_48);
        Property::operator=(this_00,&local_660);
        Property::~Property(&local_660);
        this_local._7_1_ = 1;
        ::std::__cxx11::string::~string((string *)local_48);
      }
      else {
        this_local._7_1_ = 0;
      }
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool BlendShape::add_inbetweenBlendShape(const double weight, Attribute &&attr) {

  if (attr.name().empty()) {
    return false;
  }

  if (attr.is_uniform()) {
    return false;
  }

  if (!attr.is_value()) {
    return false;
  }

  std::string attr_name = fmt::format("{}:{}", kInbetweensNamespace, attr.name());
  attr.set_name(attr_name);

  attr.metas().weight = weight;

  props[attr_name] = Property(attr, /* custom */false);

  return true;
}